

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

void __thiscall
polyscope::render::ManagedBuffer<double>::markRenderAttributeBufferUpdated
          (ManagedBuffer<double> *this)

{
  ManagedBuffer<double> *in_stack_00000060;
  DeviceBufferType in_stack_000000ac;
  ManagedBuffer<double> *in_stack_000000b0;
  
  checkDeviceBufferTypeIs(in_stack_000000b0,in_stack_000000ac);
  invalidateHostBuffer((ManagedBuffer<double> *)0x411024);
  updateIndexedViews(in_stack_00000060);
  requestRedraw();
  return;
}

Assistant:

void ManagedBuffer<T>::markRenderAttributeBufferUpdated() {
  checkDeviceBufferTypeIs(DeviceBufferType::Attribute);

  invalidateHostBuffer();
  updateIndexedViews();
  requestRedraw();
}